

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O0

void swapAndFlip(word *pAfter,int nVars,int iVarInPosition,int jVar,char *pCanonPerm,
                uint *pUCanonPhase)

{
  char cVar1;
  byte bVar2;
  int Temp;
  uint *pUCanonPhase_local;
  char *pCanonPerm_local;
  int jVar_local;
  int iVarInPosition_local;
  int nVars_local;
  word *pAfter_local;
  
  swap_ij(pAfter,nVars,iVarInPosition,jVar);
  cVar1 = pCanonPerm[iVarInPosition];
  pCanonPerm[iVarInPosition] = pCanonPerm[jVar];
  pCanonPerm[jVar] = cVar1;
  bVar2 = (byte)iVarInPosition;
  if (((*pUCanonPhase & 1 << (bVar2 & 0x1f)) != 0) !=
      ((*pUCanonPhase & 1 << ((byte)jVar & 0x1f)) != 0)) {
    *pUCanonPhase = 1 << (bVar2 & 0x1f) ^ *pUCanonPhase;
    *pUCanonPhase = 1 << ((byte)jVar & 0x1f) ^ *pUCanonPhase;
  }
  if ((*pUCanonPhase >> (bVar2 & 0x1f) & 1) != 0) {
    Kit_TruthChangePhase_64bit(pAfter,nVars,iVarInPosition);
  }
  return;
}

Assistant:

void swapAndFlip(word* pAfter, int nVars, int iVarInPosition, int jVar, char * pCanonPerm, unsigned* pUCanonPhase)
{
    int Temp;
    swap_ij(pAfter, nVars, iVarInPosition, jVar);
    
    Temp = pCanonPerm[iVarInPosition];
    pCanonPerm[iVarInPosition] = pCanonPerm[jVar];
    pCanonPerm[jVar] = Temp;
    
    if ( ((*pUCanonPhase & (1 << iVarInPosition)) > 0) != ((*pUCanonPhase & (1 << jVar)) > 0) )
    {
        *pUCanonPhase ^= (1 << iVarInPosition);
        *pUCanonPhase ^= (1 << jVar);
    }
    if((*pUCanonPhase>>iVarInPosition) & 1)
        Kit_TruthChangePhase_64bit( pAfter, nVars, iVarInPosition );
    
}